

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void check_integral_opt<int,zmq::sockopt::integral_option<89,int,false>>
               (socket_base *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2,
               char param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef capturedExpression;
  int val;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage18;
  ScopedMessage scopedMessage17;
  undefined4 local_15c;
  undefined1 local_158 [8];
  undefined8 local_150;
  char *local_148 [2];
  undefined4 local_138;
  MessageBuilder local_130;
  undefined1 local_d8 [80];
  SourceLineInfo local_88;
  ScopedMessage local_78;
  
  local_15c = 1;
  local_158 = (undefined1  [8])0x19e995;
  local_150 = 0xe5;
  macroName.m_size = 4;
  macroName.m_start = "INFO";
  Catch::MessageBuilder::MessageBuilder(&local_130,macroName,(SourceLineInfo *)local_158,Info);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 "setting ",param_2);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_130.super_MessageStream.m_stream.m_oss,(char *)local_d8._0_8_,local_d8._8_8_);
  Catch::ScopedMessage::ScopedMessage(&local_78,&local_130);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  paVar1 = &local_130.m_info.message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.m_info.message._M_dataplus._M_p != paVar1) {
    operator_delete(local_130.m_info.message._M_dataplus._M_p,
                    local_130.m_info.message.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_130);
  zmq::detail::socket_base::set_option(param_1,0x59,&local_15c,4);
  if (param_3 == '\0') {
    local_88.file =
         "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp";
    local_88.line = 0xea;
    macroName_00.m_size = 4;
    macroName_00.m_start = "INFO";
    Catch::MessageBuilder::MessageBuilder(&local_130,macroName_00,&local_88,Info);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   "getting ",param_2);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_130.super_MessageStream.m_stream.m_oss,(char *)local_158,local_150);
    Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_d8,&local_130);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,(ulong)((long)local_148[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.m_info.message._M_dataplus._M_p != paVar1) {
      operator_delete(local_130.m_info.message._M_dataplus._M_p,
                      local_130.m_info.message.field_2._M_allocated_capacity + 1);
    }
    Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_130);
    iVar2 = zmq::detail::socket_base::get<89,int,false>(param_1);
    local_158 = (undefined1  [8])0x19e995;
    local_150 = 0xec;
    macroName_01.m_size = 5;
    macroName_01.m_start = "CHECK";
    capturedExpression.m_size = 8;
    capturedExpression.m_start = "s == val";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_130,macroName_01,(SourceLineInfo *)local_158,
               capturedExpression,ContinueOnFailure);
    local_150._0_2_ = CONCAT11(iVar2 == 1,true);
    local_158 = (undefined1  [8])&PTR_streamReconstructedExpression_001dd5f0;
    local_150 = CONCAT44(iVar2,(undefined4)local_150);
    local_148[0] = "==";
    local_148[1] = (char *)0x2;
    local_138 = 1;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_130,(ITransientExpression *)local_158);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_130);
    if (local_130.m_info.message.field_2._M_local_buf[0xb] == '\0') {
      (**(code **)(*(long *)local_130.m_info.lineInfo.file + 0xa0))();
    }
    Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_d8);
  }
  Catch::ScopedMessage::~ScopedMessage(&local_78);
  return;
}

Assistant:

void check_integral_opt(Opt opt,
                        zmq::socket_t &sock,
                        std::string info,
                        bool set_only = false)
{
    const T val = 1;
    INFO("setting " + info);
    sock.set(opt, val);
    if (set_only)
        return;

    INFO("getting " + info);
    auto s = sock.get(opt);
    CHECK(s == val);
}